

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findfunction.cpp
# Opt level: O3

int searchwire(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *c,string *value,string *pvalue)

{
  long lVar1;
  pointer pbVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  size_type *psVar5;
  ulong uVar6;
  value_type local_50;
  
  pbVar2 = (c->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(c->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 5;
    __n = pvalue->_M_string_length;
    psVar5 = &pbVar2->_M_string_length;
    uVar6 = 1;
    do {
      if ((*psVar5 == __n) &&
         ((__n == 0 ||
          (iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar5 + -1))->_M_dataplus)._M_p,(pvalue->_M_dataplus)._M_p,__n),
          iVar3 == 0)))) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(c,pbVar2 + (uVar6 & 0xffffffff),value);
        pbVar2 = (c->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,",","");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_insert_rval(c,pbVar2 + (uVar6 & 0xffffffff),&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return 0;
        }
        operator_delete(local_50._M_dataplus._M_p);
        return 0;
      }
      psVar5 = psVar5 + 4;
      lVar1 = uVar6 + (-(ulong)(lVar4 == 0) - lVar4);
      uVar6 = uVar6 + 1;
    } while (lVar1 != 0);
  }
  return 0;
}

Assistant:

int searchwire(vector<string> & c,string *value, string *pvalue)
{
	for (int i = 0;i< c.size(); i++)
	{
		if (c[i] == *pvalue)
		{
			c.insert(c.begin() + (i + 1), *value);
			c.insert(c.begin() + (i + 1), ",");
			return 0;
		}
			
	}
}